

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f *
Matrix4f::perspectiveProjection(float fovYRadians,float aspect,float zNear,float zFar,bool directX)

{
  float *pfVar1;
  byte in_SIL;
  Matrix4f *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float xScale;
  float yScale;
  Matrix4f *m;
  
  Matrix4f(in_RDI,0.0);
  fVar2 = tanf(in_XMM0_Da * 0.5);
  pfVar1 = operator()(in_RDI,0,0);
  *pfVar1 = (1.0 / fVar2) / in_XMM1_Da;
  pfVar1 = operator()(in_RDI,1,1);
  *pfVar1 = 1.0 / fVar2;
  pfVar1 = operator()(in_RDI,3,2);
  *pfVar1 = -1.0;
  if ((in_SIL & 1) == 0) {
    pfVar1 = operator()(in_RDI,2,2);
    *pfVar1 = (in_XMM3_Da + in_XMM2_Da) / (in_XMM2_Da - in_XMM3_Da);
    pfVar1 = operator()(in_RDI,2,3);
    *pfVar1 = (in_XMM3_Da * 2.0 * in_XMM2_Da) / (in_XMM2_Da - in_XMM3_Da);
  }
  else {
    pfVar1 = operator()(in_RDI,2,2);
    *pfVar1 = in_XMM3_Da / (in_XMM2_Da - in_XMM3_Da);
    pfVar1 = operator()(in_RDI,2,3);
    *pfVar1 = (in_XMM2_Da * in_XMM3_Da) / (in_XMM2_Da - in_XMM3_Da);
  }
  return in_RDI;
}

Assistant:

Matrix4f Matrix4f::perspectiveProjection( float fovYRadians, float aspect, float zNear, float zFar, bool directX )
{
	Matrix4f m; // zero matrix

	float yScale = 1.f / tanf( 0.5f * fovYRadians );
	float xScale = yScale / aspect;

	m( 0, 0 ) = xScale;
	m( 1, 1 ) = yScale;
	m( 3, 2 ) = -1;

	if( directX )
	{
		m( 2, 2 ) = zFar / ( zNear - zFar );
		m( 2, 3 ) = zNear * zFar / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = ( zFar + zNear ) / ( zNear - zFar );
		m( 2, 3 ) = 2.f * zFar * zNear / ( zNear - zFar );
	}

	return m;
}